

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invalid_locale_ctype_tests.cpp
# Opt level: O0

void __thiscall iu_Locale_x_iutest_x_Invalid_Test::Body(iu_Locale_x_iutest_x_Invalid_Test *this)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertionHelper local_408;
  Fixed local_3d8;
  string local_250;
  undefined1 local_230 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_200;
  Fixed local_1d0;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_Locale_x_iutest_x_Invalid_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  pcVar2 = setlocale(0,"xxx");
  iutest::internal::NullHelper<false>::CompareEq<char>
            ((AssertionResult *)local_38,"(setlocale(0, \"xxx\"))",pcVar2);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/invalid_locale_ctype_tests.cpp"
               ,0x19,pcVar2,kAssumeFailure);
    iutest::AssertionHelper::operator=(&local_200,&local_1d0);
    iutest::AssertionHelper::~AssertionHelper(&local_200);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d0);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (iutest_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    iutest::detail::IUStreamCapture::GetStreamString_abi_cxx11_
              (&local_250,(IUStreamCapture *)&stderr_capture);
    iuutil::CmpHelperSTRIN<char[35],std::__cxx11::string>
              ((AssertionResult *)local_230,(iuutil *)"\"failed: setlocale LC_CTYPE to hoge\"",
               "stderr_capture.GetStreamString()","failed: setlocale LC_CTYPE to hoge",
               (char (*) [35])&local_250,in_R9);
    std::__cxx11::string::~string((string *)&local_250);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
    if (!bVar1) {
      memset(&local_3d8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3d8);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_230);
      iutest::AssertionHelper::AssertionHelper
                (&local_408,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/invalid_locale_ctype_tests.cpp"
                 ,0x1a,pcVar2,kFatalFailure);
      iutest::AssertionHelper::operator=(&local_408,&local_3d8);
      iutest::AssertionHelper::~AssertionHelper(&local_408);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3d8);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  }
  return;
}

Assistant:

IUTEST(Locale, Invalid)
{
    IUTEST_ASSUME_NULL(setlocale(LC_CTYPE, "xxx"));
    IUTEST_ASSERT_STRIN("failed: setlocale LC_CTYPE to hoge", stderr_capture.GetStreamString());
}